

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absUtil.c
# Opt level: O1

Vec_Int_t * Gia_VtaConvertToGla(Gia_Man_t *p,Vec_Int_t *vVta)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  Vec_Int_t *pVVar8;
  int *__s;
  uint *puVar9;
  uint uVar10;
  
  iVar1 = vVta->nSize;
  if (0 < iVar1) {
    piVar4 = vVta->pArray;
    iVar2 = *piVar4;
    if ((-2 < iVar2) && ((int)(iVar2 + 1U) < iVar1)) {
      if (piVar4[iVar2 + 1U] != iVar1) {
        __assert_fail("Vec_IntEntry(vVta, nFrames+1) == Vec_IntSize(vVta)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absUtil.c"
                      ,0x54,"Vec_Int_t *Gia_VtaConvertToGla(Gia_Man_t *, Vec_Int_t *)");
      }
      uVar3 = p->nObjs;
      uVar6 = uVar3;
      if (1 < uVar3) {
        uVar6 = uVar3 - 1;
        if (uVar6 == 0) {
          uVar6 = 0;
        }
        else {
          iVar1 = 0x1f;
          if (uVar6 != 0) {
            for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
            }
          }
          uVar6 = iVar1 + 0x21;
        }
      }
      uVar6 = ~(-1 << ((byte)uVar6 & 0x1f));
      if ((int)uVar6 < (int)uVar3) {
        __assert_fail("nObjs <= nObjMask",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absUtil.c"
                      ,0x57,"Vec_Int_t *Gia_VtaConvertToGla(Gia_Man_t *, Vec_Int_t *)");
      }
      pVVar8 = (Vec_Int_t *)malloc(0x10);
      uVar7 = 0x10;
      if (0xe < uVar3 - 1) {
        uVar7 = uVar3;
      }
      pVVar8->nSize = 0;
      pVVar8->nCap = uVar7;
      if (uVar7 == 0) {
        __s = (int *)0x0;
      }
      else {
        __s = (int *)malloc((long)(int)uVar7 << 2);
      }
      pVVar8->pArray = __s;
      pVVar8->nSize = uVar3;
      memset(__s,0,(long)(int)uVar3 << 2);
      uVar7 = iVar2 + 2;
      iVar1 = vVta->nSize;
      if ((int)uVar7 < iVar1) {
        puVar9 = (uint *)(piVar4 + uVar7);
        do {
          if (iVar2 < -2) goto LAB_005a24ff;
          uVar10 = *puVar9 & uVar6;
          if (p->nObjs <= (int)uVar10) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar5 = *(ulong *)(p->pObjs + uVar10);
          if (((~(uint)uVar5 & 0x9fffffff) != 0) ||
             ((int)((uint)(uVar5 >> 0x20) & 0x1fffffff) < p->vCis->nSize - p->nRegs)) {
            if (((~uVar5 & 0x1fffffff1fffffff) != 0) &&
               ((int)(uint)uVar5 < 0 || (~uVar5 & 0x1fffffff) == 0)) {
              __assert_fail("Gia_ObjIsRo(p, pObj) || Gia_ObjIsAnd(pObj) || Gia_ObjIsConst0(pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absUtil.c"
                            ,0x5d,"Vec_Int_t *Gia_VtaConvertToGla(Gia_Man_t *, Vec_Int_t *)");
            }
          }
          if ((int)uVar3 <= (int)uVar10) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          __s[uVar10] = __s[uVar10] + 1;
          puVar9 = puVar9 + 1;
          uVar7 = uVar7 + 1;
        } while ((int)uVar7 < iVar1);
      }
      if (0 < (int)uVar3) {
        *__s = iVar2;
        return pVVar8;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
  }
LAB_005a24ff:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Vec_Int_t * Gia_VtaConvertToGla( Gia_Man_t * p, Vec_Int_t * vVta )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vGla;
    int nObjMask, nObjs = Gia_ManObjNum(p);
    int i, Entry, nFrames = Vec_IntEntry( vVta, 0 );
    assert( Vec_IntEntry(vVta, nFrames+1) == Vec_IntSize(vVta) );
    // get the bitmask
    nObjMask = (1 << Abc_Base2Log(nObjs)) - 1;
    assert( nObjs <= nObjMask );
    // go through objects
    vGla = Vec_IntStart( nObjs );
    Vec_IntForEachEntryStart( vVta, Entry, i, nFrames+2 )
    {
        pObj = Gia_ManObj( p, (Entry &  nObjMask) );
        assert( Gia_ObjIsRo(p, pObj) || Gia_ObjIsAnd(pObj) || Gia_ObjIsConst0(pObj) );
        Vec_IntAddToEntry( vGla, (Entry &  nObjMask), 1 );
    }
    Vec_IntWriteEntry( vGla, 0, nFrames );
    return vGla;
}